

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O2

size_t __thiscall RDNSequence::SetDataSize(RDNSequence *this)

{
  pointer pRVar1;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  
  lVar5 = 0;
  sVar4 = 0;
  for (uVar3 = 0;
      pRVar1 = (this->name).
               super__Vector_base<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->name).
                             super__Vector_base<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x28);
      uVar3 = uVar3 + 1) {
    sVar2 = DerBase::EncodedSize((DerBase *)((long)&(pRVar1->super_DerBase)._vptr_DerBase + lVar5));
    sVar4 = sVar4 + sVar2;
    lVar5 = lVar5 + 0x28;
  }
  (this->super_DerBase).cbData = sVar4;
  return sVar4;
}

Assistant:

virtual size_t SetDataSize() override
	{
        size_t cbNeeded = 0; 

        // First, calculate how much is needed for the set of names
        for (size_t i = 0; i < name.size(); ++i)
        {
            size_t cbName = name[i].EncodedSize();
            cbNeeded += cbName;
        }

        return (cbData = cbNeeded);
    }